

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_views.cpp
# Opt level: O0

void populate_container(char_array_list *data,size_t element_count)

{
  size_t sVar1;
  anon_class_8_1_ba1d521d local_30;
  size_type local_28;
  size_t element_size;
  size_t sStack_18;
  unsigned_short idx;
  size_t element_count_local;
  char_array_list *data_local;
  
  sStack_18 = element_count;
  element_count_local = (size_t)data;
  for (element_size._6_2_ = 0; element_size._6_2_ < sStack_18;
      element_size._6_2_ = element_size._6_2_ + 1) {
    sVar1 = pod_array_list_entry_traits<char>::minimum_size();
    local_28 = sVar1 + element_size._6_2_;
    local_30.idx = (unsigned_short *)((long)&element_size + 6);
    iffl::
    flat_forward_list<pod_array_list_entry<char>,iffl::flat_forward_list_traits<pod_array_list_entry<char>>,std::pmr::polymorphic_allocator<char>>
    ::
    emplace_back<populate_container(iffl::flat_forward_list<pod_array_list_entry<char>,iffl::flat_forward_list_traits<pod_array_list_entry<char>>,std::pmr::polymorphic_allocator<char>>&,unsigned_long)::__0>
              ((flat_forward_list<pod_array_list_entry<char>,iffl::flat_forward_list_traits<pod_array_list_entry<char>>,std::pmr::polymorphic_allocator<char>>
                *)element_count_local,local_28,&local_30);
  }
  printf("Created collection with %zu elements\n",sStack_18);
  return;
}

Assistant:

void populate_container(char_array_list &data, size_t element_count) noexcept {
    for (unsigned short idx = 0; idx < element_count; ++idx) {
        size_t element_size{ char_array_list::traits::minimum_size() + idx * sizeof(char_array_list::value_type::type) };
        data.emplace_back(element_size,
                          [&idx] (char_array_list_entry &e,
                                  size_t element_size) noexcept {
                              e.length = idx;
                              std::fill(e.arr, e.arr + e.length, static_cast<char>(idx)+1);
                          });
    }
    std::printf("Created collection with %zu elements\n", element_count);
}